

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::RenderMarkerPlus
               (ImDrawList *DrawList,ImVec2 *c,float s,bool param_4,ImU32 col_outline,bool param_6,
               ImU32 param_7,float weight)

{
  ImVec2 local_58;
  ImVec2 IStack_50;
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  
  local_58.x = 1.0;
  local_58.y = 0.0;
  IStack_50.x = 0.0;
  IStack_50.y = -1.0;
  local_48.x = -1.0;
  local_48.y = 0.0;
  aIStack_40[0].x = 0.0;
  aIStack_40[0].y = 1.0;
  TransformMarker(&local_58,4,c,s);
  ImDrawList::AddLine(DrawList,&local_58,&local_48,col_outline,weight);
  ImDrawList::AddLine(DrawList,&IStack_50,aIStack_40,col_outline,weight);
  return;
}

Assistant:

inline void RenderMarkerPlus(ImDrawList& DrawList, const ImVec2& c, float s, bool /*outline*/, ImU32 col_outline, bool /*fill*/, ImU32 /*col_fill*/, float weight) {
    ImVec2 marker[4] = {ImVec2(1, 0), ImVec2(0, -1), ImVec2(-1, 0), ImVec2(0, 1)};
    TransformMarker(marker, 4, c, s);
    DrawList.AddLine(marker[0], marker[2], col_outline, weight);
    DrawList.AddLine(marker[1], marker[3], col_outline, weight);
}